

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O3

RotMat3x3d * __thiscall
OpenMD::StuntDouble::getA(RotMat3x3d *__return_storage_ptr__,StuntDouble *this)

{
  RotMat3x3d *pRVar1;
  double (*padVar2) [3];
  uint i;
  long lVar3;
  long lVar4;
  
  pRVar1 = __return_storage_ptr__;
  padVar2 = (double (*) [3])
            ((long)this->localIndex_ * 0x48 +
            *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).aMat.
                             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->storage_));
  if ((RotMat3x3d *)padVar2 != __return_storage_ptr__) {
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        (((SquareMatrix<double,_3> *)*(double (*) [3])__return_storage_ptr__)->
        super_RectMatrix<double,_3U,_3U>).data_[0][lVar4] =
             (((SquareMatrix<double,_3> *)*padVar2)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 1;
      __return_storage_ptr__ = (RotMat3x3d *)((long)__return_storage_ptr__ + 0x18);
      padVar2 = padVar2 + 1;
    } while (lVar3 != 3);
  }
  return pRVar1;
}

Assistant:

RotMat3x3d getA() {
      return ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .aMat[localIndex_];
    }